

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TCMallocTest_EmergencyMalloc_Test::TestBody(TCMallocTest_EmergencyMalloc_Test *this)

{
  char cVar1;
  undefined4 uVar2;
  TestingPortal *pTVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  this_00;
  long *plVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  undefined1 local_70 [8];
  void *p2;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  AssertHelper local_30;
  
  pTVar3 = tcmalloc::TestingPortal::Get();
  cVar1 = (**(code **)(*(long *)pTVar3 + 0x40))(pTVar3);
  if (cVar1 == '\0') {
    puts("EmergencyMalloc test skipped");
    return;
  }
  SetNewHook();
  SetDeleteHook();
  local_60 = (undefined1  [8])tc_malloc;
  (*noopt_helper)(local_60);
  this_00._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (*(code *)local_60)(0x20);
  local_70 = (undefined1  [8])0x0;
  VerifyNewHookWasCalled();
  local_60 = (undefined1  [8])local_70;
  (**(code **)(*(long *)pTVar3 + 0x50))
            (pTVar3,anon_func::anon_class_1_0_00000001::__invoke,local_60);
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<void*,decltype(nullptr)>
            ((internal *)local_60,"p2","nullptr",(void **)local_70,&local_40._M_head_impl);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x66a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
  }
  else {
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int_volatile,int>
              ((internal *)local_60,"g_NewHook_calls","0",&g_NewHook_calls,(int *)&local_40);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_58->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x66d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    }
    else {
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      plVar4 = (long *)MallocExtension::instance();
      uVar2 = (**(code **)(*plVar4 + 0xb8))(plVar4,this_00._M_head_impl);
      local_40._M_head_impl._0_4_ = uVar2;
      local_30.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<MallocExtension::Ownership,MallocExtension::Ownership>
                ((internal *)local_60,"MallocExtension::instance()->GetOwnership(p1)",
                 "MallocExtension::kOwned",(Ownership *)&local_40,(Ownership *)&local_30);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x670,pcVar5);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
      }
      else {
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        plVar4 = (long *)MallocExtension::instance();
        uVar2 = (**(code **)(*plVar4 + 0xb8))(plVar4,local_70);
        local_40._M_head_impl._0_4_ = uVar2;
        local_30.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<MallocExtension::Ownership,MallocExtension::Ownership>
                  ((internal *)local_60,"MallocExtension::instance()->GetOwnership(p2)",
                   "MallocExtension::kOwned",(Ownership *)&local_40,(Ownership *)&local_30);
        if (local_60[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_58->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x671,pcVar5);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
        }
        else {
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          cVar1 = (**(code **)(*(long *)pTVar3 + 0x48))(pTVar3,this_00._M_head_impl);
          local_40._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT71(local_40._M_head_impl._1_7_,cVar1) ^ 1);
          local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (cVar1 != '\0') {
            testing::Message::Message((Message *)&local_30);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_40,
                       (AssertionResult *)"portal->IsEmergencyPtr(p1)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p2,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x673,(char *)local_60);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&local_30);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2);
            if (local_60 != (undefined1  [8])&local_50) {
              operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
          }
          cVar1 = (**(code **)(*(long *)pTVar3 + 0x48))(pTVar3,local_70);
          local_40._M_head_impl._0_1_ = cVar1;
          local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (cVar1 == '\0') {
            testing::Message::Message((Message *)&local_30);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_40,
                       (AssertionResult *)"portal->IsEmergencyPtr(p2)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p2,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x674,(char *)local_60);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&local_30);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2);
            if (local_60 != (undefined1  [8])&local_50) {
              operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_30.data_._4_4_,local_30.data_._0_4_) + 8))();
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
          }
          free((void *)local_70);
          local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<int_volatile,int>
                    ((internal *)local_60,"g_DeleteHook_calls","0",&g_DeleteHook_calls,
                     (int *)&local_40);
          if (local_60[0] != (internal)0x0) {
            if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_58,local_58);
            }
            free(this_00._M_head_impl);
            VerifyDeleteHookWasCalled();
            goto LAB_00113ace;
          }
          testing::Message::Message((Message *)&local_40);
          if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_58->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x679,pcVar5);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  this_00._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_00._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00._M_head_impl,local_58);
  }
LAB_00113ace:
  tcmalloc::
  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1628:28)>
  ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1628:28)>
              *)this_00._M_head_impl);
  return;
}

Assistant:

TEST(TCMallocTest, EmergencyMalloc) {
  auto portal = TestingPortal::Get();
  if (!portal->HasEmergencyMalloc()) {
    printf("EmergencyMalloc test skipped\n");
    return;
  }

  SetNewHook();
  SetDeleteHook();
  tcmalloc::Cleanup unhook([] () {
    ResetNewHook();
    ResetDeleteHook();
  });

  void* p1 = noopt(tc_malloc)(32);
  void* p2 = nullptr;

  VerifyNewHookWasCalled();

  portal->WithEmergencyMallocEnabled([&] () {
    p2 = noopt(malloc)(32);
  });

  ASSERT_NE(p2, nullptr);

  // Emergency malloc doesn't call hook
  ASSERT_EQ(g_NewHook_calls, 0);

  // Emergency malloc pointers are recognized by MallocExtension::GetOwnership
  ASSERT_EQ(MallocExtension::instance()->GetOwnership(p1), MallocExtension::kOwned);
  ASSERT_EQ(MallocExtension::instance()->GetOwnership(p2), MallocExtension::kOwned);

  EXPECT_FALSE(portal->IsEmergencyPtr(p1));
  EXPECT_TRUE(portal->IsEmergencyPtr(p2));

  // Emergency malloc automagically does the right thing for free()
  // calls and doesn't invoke hooks.
  free(p2);
  ASSERT_EQ(g_DeleteHook_calls, 0);

  free(p1);
  VerifyDeleteHookWasCalled();
}